

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

void __thiscall OpenMD::MoleculeStamp::checkTorsions(MoleculeStamp *this)

{
  undefined8 uVar1;
  int iVar2;
  _Rb_tree_color _Var3;
  _Rb_tree_color _Var4;
  pointer piVar5;
  long lVar6;
  pointer ppBVar7;
  BondStamp *pBVar8;
  pointer ppAVar9;
  AtomStamp *this_00;
  _Tuple_impl<2UL,_int,_int> _Var10;
  bool bVar11;
  _Rb_tree_color _Var12;
  _Rb_tree_color _Var13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var15;
  pointer piVar16;
  pointer ppTVar17;
  iterator iVar18;
  TorsionStamp *this_01;
  ostream *poVar19;
  OpenMDException *pOVar20;
  int __tmp;
  pointer ppTVar21;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  vector<int,_std::allocator<int>_> *cont_01;
  vector<int,_std::allocator<int>_> *cont_02;
  ulong uVar22;
  long lVar23;
  int ghostIndex;
  _Head_base<2UL,_int,_false> local_26c;
  _Head_base<1UL,_int,_false> local_268;
  _Head_base<0UL,_int,_false> local_264;
  set<std::tuple<int,_int,_int,_int>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
  allTorsions;
  vector<int,_std::allocator<int>_> torsionAtoms;
  vector<int,_std::allocator<int>_> rigidSet;
  key_type local_1e8;
  ulong local_1d8;
  _Base_ptr local_1d0;
  AtomStamp *local_1c8;
  _Bind<std::less<int>_(std::_Placeholder<1>,_int)> local_1c0;
  _Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)> local_1b8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  lVar23 = 0;
  uVar22 = 0;
  while( true ) {
    ppTVar17 = (this->torsionStamps_).
               super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppTVar21 = (this->torsionStamps_).
               super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppTVar21 - (long)ppTVar17 >> 3) <= uVar22) {
      uVar22 = 0;
      do {
        if ((ulong)((long)ppTVar21 - (long)ppTVar17 >> 3) <= uVar22) {
          allTorsions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &allTorsions._M_t._M_impl.super__Rb_tree_header._M_header;
          allTorsions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          allTorsions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          allTorsions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          lVar23 = 0;
          uVar22 = 0;
          allTorsions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               allTorsions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          while( true ) {
            if ((ulong)((long)ppTVar21 - (long)ppTVar17 >> 3) <= uVar22) {
              uVar22 = 0;
              while (ppBVar7 = (this->bondStamps_).
                               super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                    uVar22 < (ulong)((long)(this->bondStamps_).
                                           super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppBVar7 >> 3)) {
                pBVar8 = ppBVar7[(int)uVar22];
                _Var3 = pBVar8->a;
                _Var4 = pBVar8->b;
                ppAVar9 = (this->atomStamps_).
                          super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_1c8 = ppAVar9[(int)_Var3];
                this_00 = ppAVar9[(int)_Var4];
                rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)(local_1c8->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_header
                              ._M_left;
                _Var13 = ~_S_red;
                if ((_Rb_tree_header *)
                    torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    &(local_1c8->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header) {
                  _Var13 = ((_Base_ptr)
                           ((long)torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start + 0x20))->_M_color;
                }
                local_1d0 = &(this_00->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_header;
                local_1d8 = uVar22;
                while (_Var13 != ~_S_red) {
                  if (_Var13 != _Var4) {
                    rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         (pointer)(this_00->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header.
                                  _M_header._M_left;
                    _Var12 = ~_S_red;
                    if ((_Base_ptr)
                        rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != local_1d0) {
                      _Var12 = ((_Base_ptr)
                               ((long)rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start + 0x20))->_M_color;
                    }
                    while (_Var12 != ~_S_red) {
                      if ((_Var12 != _Var3) &&
                         (ghostIndex = _Var12, local_26c._M_head_impl = _Var4,
                         local_268._M_head_impl = _Var3, local_264._M_head_impl = _Var13,
                         iVar18 = std::
                                  _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                                  ::find(&allTorsions._M_t,(key_type *)&ghostIndex),
                         (_Rb_tree_header *)iVar18._M_node ==
                         &allTorsions._M_t._M_impl.super__Rb_tree_header)) {
                        std::
                        _Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                        ::_M_insert_unique<std::tuple<int,int,int,int>const&>
                                  ((_Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                                    *)&allTorsions,(tuple<int,_int,_int,_int> *)&ghostIndex);
                        this_01 = (TorsionStamp *)operator_new(0xf0);
                        TorsionStamp::TorsionStamp(this_01);
                        TorsionStamp::setMembers(this_01,(tuple<int,_int,_int,_int> *)&ghostIndex);
                        addTorsionStamp(this,this_01);
                      }
                      _Var12 = AtomStamp::getNextBondedAtom(this_00,(AtomIter *)&rigidSet);
                    }
                  }
                  _Var13 = AtomStamp::getNextBondedAtom(local_1c8,(AtomIter *)&torsionAtoms);
                }
                uVar22 = local_1d8 + 1;
              }
              std::
              _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
              ::~_Rb_tree(&allTorsions._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
              return;
            }
            lVar6 = *(long *)((long)ppTVar17 + (lVar23 >> 0x1d));
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)
                       &rigidSet.super__Vector_base<int,_std::allocator<int>_>,
                       (vector<int,_std::allocator<int>_> *)(lVar6 + 0x98));
            if ((long)rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start == 0xc) {
              ghostIndex = *(int *)(lVar6 + 0x94);
              _Var14 = std::
                       __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                 (rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish,&ghostIndex);
              if (_Var14._M_current !=
                  rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<int,_std::allocator<int>_>::insert
                          ((vector<int,_std::allocator<int>_> *)
                           &rigidSet.super__Vector_base<int,_std::allocator<int>_>,
                           (const_iterator)_Var14._M_current,&ghostIndex);
              }
            }
            uVar1._0_4_ = rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[2];
            uVar1._4_4_ = rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[3];
            local_1e8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
            super__Head_base<2UL,_int,_false>._M_head_impl = uVar1._0_4_;
            local_1e8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int>.
            super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
                 (_Head_base<3UL,_int,_false>)(_Head_base<3UL,_int,_false>)uVar1._4_4_;
            _Var10.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>._M_head_impl =
                 (_Head_base<3UL,_int,_false>)
                 rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[0];
            _Var10.super__Head_base<2UL,_int,_false>._M_head_impl =
                 rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
            local_1e8.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
            _M_head_impl = *rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
            local_1e8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
            super__Tuple_impl<1UL,_int,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
                 rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
            if (uVar1._4_4_ <
                *rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start) {
              local_1e8.super__Tuple_impl<0UL,_int,_int,_int,_int>.
              super__Tuple_impl<1UL,_int,_int,_int>.super__Tuple_impl<2UL,_int,_int> = _Var10;
              local_1e8.super__Tuple_impl<0UL,_int,_int,_int,_int>._8_8_ = uVar1;
            }
            iVar18 = std::
                     _Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                     ::find((_Rb_tree<std::tuple<int,_int,_int,_int>,_std::tuple<int,_int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int,_int>_>,_std::less<std::tuple<int,_int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
                             *)&allTorsions,&local_1e8);
            if ((_Rb_tree_header *)iVar18._M_node != &allTorsions._M_t._M_impl.super__Rb_tree_header
               ) break;
            std::
            _Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
            ::_M_insert_unique<std::tuple<int,int,int,int>const&>
                      ((_Rb_tree<std::tuple<int,int,int,int>,std::tuple<int,int,int,int>,std::_Identity<std::tuple<int,int,int,int>>,std::less<std::tuple<int,int,int,int>>,std::allocator<std::tuple<int,int,int,int>>>
                        *)&allTorsions,&local_1e8);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&rigidSet.super__Vector_base<int,_std::allocator<int>_>);
            uVar22 = uVar22 + 1;
            ppTVar17 = (this->torsionStamps_).
                       super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppTVar21 = (this->torsionStamps_).
                       super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            lVar23 = lVar23 + 0x100000000;
          }
          poVar19 = std::operator<<((ostream *)&oss,"Error in Molecule ");
          std::__cxx11::string::string((string *)&ghostIndex,(string *)&(this->Name).data_);
          poVar19 = std::operator<<(poVar19,(string *)&ghostIndex);
          poVar19 = std::operator<<(poVar19,": ");
          poVar19 = std::operator<<(poVar19,"Torsion");
          containerToString<std::vector<int,std::allocator<int>>>
                    ((string *)&torsionAtoms,(OpenMD *)&rigidSet,cont_02);
          poVar19 = std::operator<<(poVar19,(string *)&torsionAtoms);
          std::operator<<(poVar19," appears multiple times\n");
          std::__cxx11::string::~string((string *)&torsionAtoms);
          std::__cxx11::string::~string((string *)&ghostIndex);
          pOVar20 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar20,(string *)&ghostIndex);
          __cxa_throw(pOVar20,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &torsionAtoms.super__Vector_base<int,_std::allocator<int>_>,
                   &ppTVar17[(int)uVar22]->members_);
        allTorsions._M_t._M_impl._0_4_ = 0;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &rigidSet.super__Vector_base<int,_std::allocator<int>_>,
                   (long)(this->rigidBodyStamps_).
                         super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->rigidBodyStamps_).
                         super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,
                   (value_type_conflict2 *)&allTorsions,(allocator_type *)&ghostIndex);
        piVar5 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (piVar16 = torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            piVar16 !=
            torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish; piVar16 = piVar16 + 1) {
          lVar23 = (long)piVar5[*piVar16];
          if ((-1 < lVar23) &&
             (iVar2 = rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar23],
             rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar23] = iVar2 + 1, 2 < iVar2)) {
            poVar19 = std::operator<<((ostream *)&oss,"Error in Molecule ");
            std::__cxx11::string::string((string *)&allTorsions,(string *)&(this->Name).data_);
            poVar19 = std::operator<<(poVar19,(string *)&allTorsions);
            poVar19 = std::operator<<(poVar19,": torsion");
            containerToString<std::vector<int,std::allocator<int>>>
                      ((string *)&ghostIndex,(OpenMD *)&torsionAtoms,cont);
            poVar19 = std::operator<<(poVar19,(string *)&ghostIndex);
            std::operator<<(poVar19,"has four atoms on the same rigid body\n");
            std::__cxx11::string::~string((string *)&ghostIndex);
            std::__cxx11::string::~string((string *)&allTorsions);
            pOVar20 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(pOVar20,(string *)&allTorsions);
            __cxa_throw(pOVar20,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&rigidSet.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&torsionAtoms.super__Vector_base<int,_std::allocator<int>_>);
        uVar22 = uVar22 + 1;
        ppTVar17 = (this->torsionStamps_).
                   super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppTVar21 = (this->torsionStamps_).
                   super__Vector_base<OpenMD::TorsionStamp_*,_std::allocator<OpenMD::TorsionStamp_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      } while( true );
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &torsionAtoms.super__Vector_base<int,_std::allocator<int>_>,
               (vector<int,_std::allocator<int>_> *)
               (*(long *)((long)ppTVar17 + (lVar23 >> 0x1d)) + 0x98));
    local_1b8._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>)
         (((long)(this->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
    _Var14 = std::
             find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,&local_1b8);
    local_1c0._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_int>.
    super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
         (_Tuple_impl<0UL,_std::_Placeholder<1>,_int>)(_Tuple_impl<1UL,_int>)0x0;
    _Var15 = std::
             find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,&local_1c0);
    if ((_Var14._M_current !=
         torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) ||
       (_Var15._M_current !=
        torsionAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish)) break;
    bVar11 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                       ((vector<int,_std::allocator<int>_> *)
                        &torsionAtoms.super__Vector_base<int,_std::allocator<int>_>);
    if (bVar11) {
      poVar19 = std::operator<<((ostream *)&oss,"Error in Molecule ");
      std::__cxx11::string::string((string *)&allTorsions,(string *)&(this->Name).data_);
      poVar19 = std::operator<<(poVar19,(string *)&allTorsions);
      poVar19 = std::operator<<(poVar19," : atoms of torsion");
      containerToString<std::vector<int,std::allocator<int>>>
                ((string *)&ghostIndex,(OpenMD *)&torsionAtoms,cont_01);
      poVar19 = std::operator<<(poVar19,(string *)&ghostIndex);
      std::operator<<(poVar19," have duplicated indices\n");
      std::__cxx11::string::~string((string *)&ghostIndex);
      std::__cxx11::string::~string((string *)&allTorsions);
      pOVar20 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      OpenMDException::OpenMDException(pOVar20,(string *)&allTorsions);
      __cxa_throw(pOVar20,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&torsionAtoms.super__Vector_base<int,_std::allocator<int>_>);
    uVar22 = uVar22 + 1;
    lVar23 = lVar23 + 0x100000000;
  }
  poVar19 = std::operator<<((ostream *)&oss,"Error in Molecule ");
  std::__cxx11::string::string((string *)&allTorsions,(string *)&(this->Name).data_);
  poVar19 = std::operator<<(poVar19,(string *)&allTorsions);
  poVar19 = std::operator<<(poVar19,": atoms of torsion");
  containerToString<std::vector<int,std::allocator<int>>>
            ((string *)&ghostIndex,(OpenMD *)&torsionAtoms,cont_00);
  poVar19 = std::operator<<(poVar19,(string *)&ghostIndex);
  std::operator<<(poVar19," have invalid indices\n");
  std::__cxx11::string::~string((string *)&ghostIndex);
  std::__cxx11::string::~string((string *)&allTorsions);
  pOVar20 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(pOVar20,(string *)&allTorsions);
  __cxa_throw(pOVar20,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void MoleculeStamp::checkTorsions() {
    std::ostringstream oss;
    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp    = getTorsionStamp(i);
      std::vector<int> torsionAtoms = torsionStamp->getMembers();
      std::vector<int>::iterator j =
          std::find_if(torsionAtoms.begin(), torsionAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(torsionAtoms.begin(), torsionAtoms.end(),
                       std::bind(std::less<int>(), std::placeholders::_1, 0));

      if (j != torsionAtoms.end() || k != torsionAtoms.end()) {
        oss << "Error in Molecule " << getName() << ": atoms of torsion"
            << containerToString(torsionAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }
      if (hasDuplicateElement(torsionAtoms)) {
        oss << "Error in Molecule " << getName() << " : atoms of torsion"
            << containerToString(torsionAtoms) << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp    = getTorsionStamp(i);
      std::vector<int> torsionAtoms = torsionStamp->getMembers();
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = torsionAtoms.begin(); j != torsionAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 3) {
            oss << "Error in Molecule " << getName() << ": torsion"
                << containerToString(torsionAtoms)
                << "has four atoms on the same rigid body\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int, int>> allTorsions;
    std::set<std::tuple<int, int, int, int>>::iterator iter;

    for (std::size_t i = 0; i < getNTorsions(); ++i) {
      TorsionStamp* torsionStamp = getTorsionStamp(i);
      std::vector<int> torsion   = torsionStamp->getMembers();
      if (torsion.size() == 3) {
        int ghostIndex = torsionStamp->getGhostVectorSource();
        std::vector<int>::iterator j =
            std::find(torsion.begin(), torsion.end(), ghostIndex);
        if (j != torsion.end()) { torsion.insert(j, ghostIndex); }
      }

      std::tuple<int, int, int, int> torsionTuple {torsion[0], torsion[1],
                                                   torsion[2], torsion[3]};
      auto& [first, second, third, fourth] = torsionTuple;

      if (first > fourth) {
        std::swap(first, fourth);
        std::swap(second, third);
      }

      iter = allTorsions.find(torsionTuple);
      if (iter == allTorsions.end()) {
        allTorsions.insert(torsionTuple);
      } else {
        oss << "Error in Molecule " << getName() << ": "
            << "Torsion" << containerToString(torsion)
            << " appears multiple times\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      int b                = bondStamp->getA();
      int c                = bondStamp->getB();

      AtomStamp* atomB = getAtomStamp(b);
      AtomStamp* atomC = getAtomStamp(c);

      AtomStamp::AtomIter ai2;
      AtomStamp::AtomIter ai3;

      for (int a = atomB->getFirstBondedAtom(ai2); a != -1;
           a     = atomB->getNextBondedAtom(ai2)) {
        if (a == c) continue;

        for (int d = atomC->getFirstBondedAtom(ai3); d != -1;
             d     = atomC->getNextBondedAtom(ai3)) {
          if (d == b) continue;

          std::tuple<int, int, int, int> newTorsion {a, b, c, d};
          auto [first, second, third, fourth] = newTorsion;

          // make sure the first element is always less than or equal
          // to the fourth element in IntTuple4
          if (first > fourth) {
            std::swap(first, fourth);
            std::swap(second, third);
          }

          if (allTorsions.find(newTorsion) == allTorsions.end()) {
            allTorsions.insert(newTorsion);
            TorsionStamp* newTorsionStamp = new TorsionStamp();
            newTorsionStamp->setMembers(newTorsion);
            addTorsionStamp(newTorsionStamp);
          }
        }
      }
    }
  }